

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O1

ptr<rpc_client> __thiscall nuraft::FakeNetwork::create_client(FakeNetwork *this,string *endpoint)

{
  string *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeNetwork>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeNetwork>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeNetwork>_>_>_>
  *this_01;
  int iVar1;
  iterator iVar2;
  iterator __position;
  _Node *p_Var3;
  mapped_type *pmVar4;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  ptr<rpc_client> pVar6;
  ptr<FakeClient> ret;
  FakeNetwork *dst_net;
  undefined1 local_59;
  rpc_client_factory local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  pthread_mutex_t *local_48;
  FakeNetwork *local_40;
  FakeNetwork *local_38;
  
  this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeNetwork>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeNetwork>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeNetwork>_>_>_>
             *)endpoint[2]._M_dataplus._M_p;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeNetwork>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeNetwork>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeNetwork>_>_>_>
          ::find(this_01,in_RDX);
  if ((_Rb_tree_header *)iVar2._M_node == &(this_01->_M_impl).super__Rb_tree_header) {
    local_40 = (FakeNetwork *)0x0;
  }
  else {
    local_40 = *(FakeNetwork **)(iVar2._M_node + 2);
  }
  if (local_40 == (FakeNetwork *)0x0) {
    (this->super_rpc_client_factory)._vptr_rpc_client_factory = (_func_int **)0x0;
    (this->super_rpc_listener)._vptr_rpc_listener = (_func_int **)0x0;
    _Var5._M_pi = extraout_RDX;
  }
  else {
    local_48 = (pthread_mutex_t *)&endpoint[4].field_2;
    iVar1 = pthread_mutex_lock(local_48);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    this_00 = endpoint + 3;
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
                         *)this_00,in_RDX);
    if (__position._M_node != (_Base_ptr)&endpoint[3]._M_string_length) {
      p_Var3 = std::__cxx11::
               list<std::shared_ptr<nuraft::FakeClient>,std::allocator<std::shared_ptr<nuraft::FakeClient>>>
               ::_M_create_node<std::shared_ptr<nuraft::FakeClient>const&>
                         ((list<std::shared_ptr<nuraft::FakeClient>,std::allocator<std::shared_ptr<nuraft::FakeClient>>>
                           *)(endpoint[5].field_2._M_local_buf + 8),
                          (shared_ptr<nuraft::FakeClient> *)(__position._M_node + 2));
      std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
      endpoint[6]._M_string_length = endpoint[6]._M_string_length + 1;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
      ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
                      *)this_00,(const_iterator)__position._M_node);
    }
    local_58._vptr_rpc_client_factory = (_func_int **)0x0;
    local_38 = (FakeNetwork *)endpoint;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::FakeClient,std::allocator<nuraft::FakeClient>,nuraft::FakeNetwork*,nuraft::FakeNetwork*&>
              (&_Stack_50,(FakeClient **)&local_58,(allocator<nuraft::FakeClient> *)&local_59,
               &local_38,&local_40);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
                           *)this_00,in_RDX);
    (pmVar4->super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)local_58._vptr_rpc_client_factory;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar4->super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,&_Stack_50);
    _Var5._M_pi = _Stack_50._M_pi;
    (this->super_rpc_listener)._vptr_rpc_listener = (_func_int **)0x0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_rpc_client_factory)._vptr_rpc_client_factory = local_58._vptr_rpc_client_factory;
    (this->super_rpc_listener)._vptr_rpc_listener = (_func_int **)_Var5._M_pi;
    pthread_mutex_unlock(local_48);
    _Var5._M_pi = extraout_RDX_00;
  }
  pVar6.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  pVar6.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<rpc_client>)pVar6.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<rpc_client> FakeNetwork::create_client(const std::string& endpoint) {
    FakeNetwork* dst_net = base->findNetwork(endpoint);
    if (!dst_net) return nullptr;

    std::lock_guard<std::mutex> ll(clientsLock);
    auto entry = clients.find(endpoint);
    if (entry != clients.end()) {
        // Already exists, move it to garbage list as it will be
        // replaced below.
        staleClients.push_back(entry->second);
        clients.erase(entry);
    }

    ptr<FakeClient> ret = cs_new<FakeClient>(this, dst_net);
    clients[endpoint] = ret;
    return ret;
}